

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nativefunction.cpp
# Opt level: O1

void sos::NativeFunction::equals(VariableStack *stack)

{
  int iVar1;
  bool item;
  string local_48;
  string local_28;
  
  VariableStack::take_abi_cxx11_(&local_28,stack);
  VariableStack::take_abi_cxx11_(&local_48,stack);
  if (local_28._M_string_length == local_48._M_string_length) {
    if (local_28._M_string_length == 0) {
      item = true;
    }
    else {
      iVar1 = bcmp(local_28._M_dataplus._M_p,local_48._M_dataplus._M_p,local_28._M_string_length);
      item = iVar1 == 0;
    }
  }
  else {
    item = false;
  }
  VariableStack::load(stack,item);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void sos::NativeFunction::equals(sos::VariableStack *stack) {
    stack->load(stack->take() == stack->take());
}